

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_assertion_tests.cpp
# Opt level: O0

void same_stl_string_reference_and_pointer_are_equal(void)

{
  string *this;
  Constraint_ *pCVar1;
  string alice_reference;
  allocator local_39;
  string local_38 [35];
  undefined1 local_15;
  allocator local_1;
  
  this = (string *)operator_new(0x20);
  local_15 = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(this,"alice",&local_1);
  local_15 = 0;
  alice_pointer_abi_cxx11_ = (string *)this;
  std::allocator<char>::~allocator((allocator<char> *)&local_1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"alice",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  pCVar1 = (Constraint_ *)
           cgreen::create_equal_to_string_constraint
                     ((string *)alice_pointer_abi_cxx11_,"alice_pointer");
  cgreen::assert_that_
            ("/workspace/llm4binary/github/license_c_cmakelists/cgreen-devs[P]cgreen/tests/cpp_assertion_tests.cpp"
             ,0x99,"alice_reference",local_38,pCVar1);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

Ensure(same_stl_string_reference_and_pointer_are_equal) {
    alice_pointer = new std::string("alice");
    std::string alice_reference("alice");

    assert_that(alice_reference, is_equal_to_string(alice_pointer));
}